

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddSat.c
# Opt level: O3

DdNode * Cudd_ShortestPath(DdManager *manager,DdNode *f,int *weight,int *support,int *length)

{
  int iVar1;
  uint uVar2;
  st__table *visited;
  long lVar3;
  uint *key;
  uint *puVar4;
  ulong uVar5;
  DdNode *pDVar6;
  DdNode *pDVar7;
  ulong uVar8;
  int iVar9;
  uint *puVar10;
  cuddPathPair *rootPair;
  cuddPathPair *T_pair;
  uint local_a0;
  int local_9c;
  char *local_48;
  int *local_40;
  int *local_38;
  
  pDVar7 = manager->one;
  pDVar6 = manager->zero;
  one = pDVar7;
  zero = pDVar6;
  if ((support != (int *)0x0) && (0 < manager->size)) {
    lVar3 = 0;
    do {
      support[lVar3] = 0;
      lVar3 = lVar3 + 1;
    } while (lVar3 < manager->size);
  }
  pDVar7 = (DdNode *)((ulong)pDVar7 ^ 1);
  local_9c = 1000000;
  if (pDVar6 != f && pDVar7 != f) {
    key = (uint *)((ulong)f & 0xfffffffffffffffe);
    do {
      manager->reordered = 0;
      visited = st__init_table(st__ptrcmp,st__ptrhash);
      getShortest(f,weight,support,visited);
      iVar1 = st__lookup(visited,(char *)key,&local_48);
      pDVar6 = one;
      if (iVar1 == 0) {
        return (DdNode *)0x0;
      }
      local_9c = *(int *)(local_48 + ((uint)f * 4 & 4));
      uVar5 = (ulong)one & 0xfffffffffffffffe;
      *(int *)(uVar5 + 4) = *(int *)(uVar5 + 4) + 1;
      uVar2 = *key;
      puVar10 = key;
      local_a0 = (uint)f & 1;
      iVar1 = local_9c;
joined_r0x007fc3d3:
      pDVar7 = pDVar6;
      if (uVar2 != 0x7fffffff) {
        do {
          if (weight == (int *)0x0) {
            iVar9 = 1;
          }
          else {
            iVar9 = weight[uVar2];
          }
          iVar9 = iVar1 - iVar9;
          uVar8 = *(ulong *)(puVar10 + 6) ^ 1;
          uVar5 = *(ulong *)(puVar10 + 4) ^ 1;
          if (local_a0 == 0) {
            uVar8 = *(ulong *)(puVar10 + 6);
            uVar5 = *(ulong *)(puVar10 + 4);
          }
          puVar4 = (uint *)(uVar5 & 0xfffffffffffffffe);
          st__lookup(visited,(char *)puVar4,(char **)&local_38);
          if ((uVar5 & 1) == 0) {
            if (*local_38 == iVar9) goto LAB_007fc50d;
          }
          else if (local_38[1] == iVar9) {
            local_a0 = 1;
            goto LAB_007fc51f;
          }
          puVar4 = (uint *)(uVar8 & 0xfffffffffffffffe);
          st__lookup(visited,(char *)puVar4,(char **)&local_40);
          local_a0 = (uint)uVar8 & 1;
          if ((uVar8 & 1) == 0) {
            iVar9 = *local_40;
          }
          else {
            iVar9 = local_40[1];
          }
          if (iVar9 != iVar1) {
            fwrite("We shouldn\'t be here!!\n",0x17,1,(FILE *)manager->err);
            manager->errorCode = CUDD_INTERNAL_ERROR;
LAB_007fc5c0:
            pDVar7 = (DdNode *)0x0;
            goto LAB_007fc5c6;
          }
          pDVar7 = cuddBddAndRecur(manager,(DdNode *)((ulong)manager->vars[*puVar10] ^ 1),pDVar6);
          if (pDVar7 == (DdNode *)0x0) {
            Cudd_RecursiveDeref(manager,pDVar6);
            goto LAB_007fc5c0;
          }
          uVar5 = (ulong)pDVar7 & 0xfffffffffffffffe;
          *(int *)(uVar5 + 4) = *(int *)(uVar5 + 4) + 1;
          Cudd_RecursiveDeref(manager,pDVar6);
          uVar2 = *puVar4;
          pDVar6 = pDVar7;
          puVar10 = puVar4;
          if (uVar2 == 0x7fffffff) break;
        } while( true );
      }
      *(int *)(uVar5 + 4) = *(int *)(uVar5 + 4) + -1;
LAB_007fc5c6:
      st__foreach(visited,freePathPair,(char *)0x0);
      st__free_table(visited);
    } while (manager->reordered == 1);
  }
  *length = local_9c;
  return pDVar7;
LAB_007fc50d:
  local_a0 = 0;
LAB_007fc51f:
  pDVar7 = cuddBddAndRecur(manager,manager->vars[*puVar10],pDVar6);
  if (pDVar7 == (DdNode *)0x0) {
    Cudd_RecursiveDeref(manager,pDVar6);
    pDVar7 = (DdNode *)0x0;
    goto LAB_007fc5c6;
  }
  uVar5 = (ulong)pDVar7 & 0xfffffffffffffffe;
  *(int *)(uVar5 + 4) = *(int *)(uVar5 + 4) + 1;
  Cudd_RecursiveDeref(manager,pDVar6);
  uVar2 = *puVar4;
  puVar10 = puVar4;
  iVar1 = iVar9;
  pDVar6 = pDVar7;
  goto joined_r0x007fc3d3;
}

Assistant:

DdNode *
Cudd_ShortestPath(
  DdManager * manager,
  DdNode * f,
  int * weight,
  int * support,
  int * length)
{
    DdNode      *F;
    st__table    *visited;
    DdNode      *sol;
    cuddPathPair *rootPair;
    int         complement, cost;
    int         i;

    one = DD_ONE(manager);
    zero = DD_ZERO(manager);

    /* Initialize support. Support does not depend on variable order.
    ** Hence, it does not need to be reinitialized if reordering occurs.
    */
    if (support) {
      for (i = 0; i < manager->size; i++) {
        support[i] = 0;
      }
    }

    if (f == Cudd_Not(one) || f == zero) {
      *length = DD_BIGGY;
      return(Cudd_Not(one));
    }
    /* From this point on, a path exists. */

    do {
        manager->reordered = 0;

        /* Initialize visited table. */
        visited = st__init_table( st__ptrcmp, st__ptrhash);

        /* Now get the length of the shortest path(s) from f to 1. */
        (void) getShortest(f, weight, support, visited);

        complement = Cudd_IsComplement(f);

        F = Cudd_Regular(f);

        if (! st__lookup(visited, (const char *)F, (char **)&rootPair)) return(NULL);

        if (complement) {
          cost = rootPair->neg;
        } else {
          cost = rootPair->pos;
        }

        /* Recover an actual shortest path. */
        sol = getPath(manager,visited,f,weight,cost);

        st__foreach(visited, freePathPair, NULL);
        st__free_table(visited);

    } while (manager->reordered == 1);

    *length = cost;
    return(sol);

}